

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.cpp
# Opt level: O2

void duckdb::TypeOfFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  Value v;
  string local_70 [32];
  Value local_50 [64];
  
  vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)args,0);
  duckdb::LogicalType::ToString_abi_cxx11_();
  duckdb::Value::Value(local_50,local_70);
  std::__cxx11::string::~string(local_70);
  duckdb::Vector::Reference((Value *)result);
  duckdb::Value::~Value(local_50);
  return;
}

Assistant:

static void TypeOfFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	Value v(args.data[0].GetType().ToString());
	result.Reference(v);
}